

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O1

void helper_msa_binsri_df_mips64el
               (CPUMIPSState_conflict10 *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t u5)

{
  long lVar1;
  long lVar2;
  int32_t sh_d;
  int iVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  byte bVar7;
  ushort uVar8;
  
  if (3 < df) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                  ,0x11f2,
                  "void helper_msa_binsri_df_mips64el(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                 );
  }
  lVar1 = (ulong)wd * 0x10 + 0x338;
  lVar2 = (ulong)ws * 0x10 + 0x338;
  switch(df) {
  case 0:
    iVar3 = (u5 & 7) + 1;
    lVar4 = 0;
    do {
      bVar7 = *(byte *)((long)(env->active_fpu).fpr + lVar4 + lVar2 + -0x338);
      if (iVar3 != 8) {
        bVar7 = bVar7 & (byte)(0xff >> ((byte)(u5 & 7) ^ 7)) |
                *(byte *)((long)(env->active_fpu).fpr + lVar4 + lVar1 + -0x338) &
                (byte)(-1 << (sbyte)iVar3);
      }
      *(byte *)((long)(env->active_fpu).fpr + lVar4 + lVar1 + -0x338) = bVar7;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x10);
    break;
  case 1:
    bVar7 = (byte)(u5 & 0xf);
    lVar4 = 0;
    do {
      uVar8 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 * 2 + lVar2 + -0x338);
      if ((u5 & 0xf) != 0xf) {
        uVar8 = *(ushort *)((long)(env->active_fpu).fpr + lVar4 * 2 + lVar1 + -0x338) &
                (ushort)(-2 << bVar7) | uVar8 & (ushort)(0xffff >> (bVar7 ^ 0xf));
      }
      *(ushort *)((long)(env->active_fpu).fpr + lVar4 * 2 + lVar1 + -0x338) = uVar8;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 8);
    break;
  case 2:
    iVar3 = (u5 & 0x1f) + 1;
    lVar4 = 0;
    do {
      uVar5 = *(uint *)((long)(env->active_fpu).fpr + lVar4 * 4 + lVar2 + -0x338);
      if (iVar3 != 0x20) {
        uVar5 = uVar5 & (uint)(0xffffffffL >> ((byte)(u5 & 0x1f) ^ 0x1f)) |
                *(uint *)((long)(env->active_fpu).fpr + lVar4 * 4 + lVar1 + -0x338) &
                (uint)(-1L << (sbyte)iVar3);
      }
      *(uint *)((long)(env->active_fpu).fpr + lVar4 * 4 + lVar1 + -0x338) = uVar5;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    break;
  case 3:
    iVar3 = (u5 & 0x3f) + 1;
    lVar4 = 0;
    do {
      uVar6 = *(ulong *)((long)(env->active_fpu).fpr + lVar4 * 8 + lVar2 + -0x338);
      if (iVar3 != 0x40) {
        uVar6 = uVar6 & 0xffffffffffffffffU >> (~(byte)(u5 & 0x3f) & 0x3f) |
                *(ulong *)((long)(env->active_fpu).fpr + lVar4 * 8 + lVar1 + -0x338) &
                -1L << ((byte)iVar3 & 0x3f);
      }
      *(ulong *)((long)(env->active_fpu).fpr + lVar4 * 8 + lVar1 + -0x338) = uVar6;
      lVar4 = lVar4 + 1;
    } while (lVar4 == 1);
  }
  return;
}

Assistant:

static inline int64_t msa_subs_s_df(uint32_t df, int64_t arg1, int64_t arg2)
{
    int64_t max_int = DF_MAX_INT(df);
    int64_t min_int = DF_MIN_INT(df);
    if (arg2 > 0) {
        return (min_int + arg2 < arg1) ? arg1 - arg2 : min_int;
    } else {
        return (arg1 < max_int + arg2) ? arg1 - arg2 : max_int;
    }
}